

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

parser_error parse_prefs_feat(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  char *pcVar4;
  char *pcVar5;
  parser_error pVar6;
  long lVar7;
  
  pcVar4 = parser_getsym(p,"idx");
  pcVar5 = (char *)parser_priv(p);
  if (pcVar5 == (char *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                  ,0x326,"enum parser_error parse_prefs_feat(struct parser *)");
  }
  pVar6 = PARSE_ERROR_NONE;
  if (*pcVar5 == '\0') {
    wVar1 = lookup_feat_code(pcVar4);
    if (wVar1 < L'\0') {
      wVar1 = lookup_feat(pcVar4);
    }
    if ((uint)wVar1 < 0x19) {
      pcVar4 = parser_getsym(p,"lighting");
      iVar2 = strcmp(pcVar4,"torch");
      if (iVar2 == 0) {
        iVar2 = 1;
      }
      else {
        iVar2 = strcmp(pcVar4,"los");
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
          iVar2 = strcmp(pcVar4,"lit");
          if (iVar2 == 0) {
            iVar2 = 2;
          }
          else {
            iVar2 = strcmp(pcVar4,"dark");
            if (iVar2 != 0) {
              if (*pcVar4 != '*') {
                return PARSE_ERROR_INVALID_LIGHTING;
              }
              if (pcVar4[1] != '\0') {
                return PARSE_ERROR_INVALID_LIGHTING;
              }
              for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 8) {
                wVar3 = parser_getint(p,"attr");
                *(char *)(*(long *)((long)feat_x_attr + lVar7) + (ulong)(uint)wVar1) = (char)wVar3;
                wVar3 = parser_getint(p,"char");
                *(wchar_t *)(*(long *)((long)feat_x_char + lVar7) + (ulong)(uint)wVar1 * 4) = wVar3;
              }
              return PARSE_ERROR_NONE;
            }
            iVar2 = 3;
          }
        }
      }
      wVar3 = parser_getint(p,"attr");
      *(char *)(*(long *)((long)feat_x_attr + (ulong)(uint)(iVar2 << 3)) + (ulong)(uint)wVar1) =
           (char)wVar3;
      wVar3 = parser_getint(p,"char");
      *(wchar_t *)
       (*(long *)((long)feat_x_char + (ulong)(uint)(iVar2 << 3)) + (ulong)(uint)wVar1 * 4) = wVar3;
      pVar6 = PARSE_ERROR_NONE;
    }
    else {
      pVar6 = PARSE_ERROR_OUT_OF_BOUNDS;
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_prefs_feat(struct parser *p)
{
	const char *sym = parser_getsym(p, "idx");
	int idx;
	const char *lighting;
	int light_idx;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	idx = lookup_feat_code(sym);
	if (idx < 0) {
		/*
		 * To tolerate user preference files written before the
		 * post 4.2.4 change that introduced terrain codes,
		 * try looking up by the feature's printable name.  This
		 * could be dropped when a future version (4.3.*) drops
		 * save file compatibility.
		 */
		idx = lookup_feat(sym);
	}
	if (idx < 0 || idx >= FEAT_MAX) {
		return PARSE_ERROR_OUT_OF_BOUNDS;
	}

	lighting = parser_getsym(p, "lighting");
	if (streq(lighting, "torch"))
		light_idx = LIGHTING_TORCH;
	else if (streq(lighting, "los"))
		light_idx = LIGHTING_LOS;
	else if (streq(lighting, "lit"))
		light_idx = LIGHTING_LIT;
	else if (streq(lighting, "dark"))
		light_idx = LIGHTING_DARK;
	else if (streq(lighting, "*"))
		light_idx = LIGHTING_MAX;
	else
		return PARSE_ERROR_INVALID_LIGHTING;

	if (light_idx < LIGHTING_MAX) {
		feat_x_attr[light_idx][idx] = (uint8_t)parser_getint(p, "attr");
		feat_x_char[light_idx][idx] = (wchar_t)parser_getint(p, "char");
	} else {
		for (light_idx = 0; light_idx < LIGHTING_MAX; light_idx++) {
			feat_x_attr[light_idx][idx] = (uint8_t)parser_getint(p, "attr");
			feat_x_char[light_idx][idx] = (wchar_t)parser_getint(p, "char");
		}
	}

	return PARSE_ERROR_NONE;
}